

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O2

void __thiscall
booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::increment
          (segment_index_iterator<std::_List_iterator<wchar_t>_> *this)

{
  unsigned_long uVar1;
  element_type *peVar2;
  bool bVar3;
  size_t sVar4;
  ulong uVar5;
  size_t offset;
  pair<unsigned_long,_unsigned_long> pos;
  
  uVar1 = (this->current_).second;
  offset = uVar1;
  if (this->full_select_ == false) {
    uVar5 = (this->current_).first;
    do {
      peVar2 = (this->map_->index_).
               super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      if ((ulong)((long)(peVar2->
                        super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(peVar2->
                        super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 4) <= offset) break;
      sVar4 = offset + 1;
      bVar3 = valid_offset(this,sVar4);
      uVar5 = offset;
      offset = sVar4;
    } while (!bVar3);
  }
  else {
    do {
      peVar2 = (this->map_->index_).
               super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      sVar4 = (long)(peVar2->
                    super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(peVar2->
                    super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 4;
      if (sVar4 <= offset) goto LAB_001260ba;
      offset = offset + 1;
      bVar3 = valid_offset(this,offset);
    } while (!bVar3);
    peVar2 = (this->map_->index_).
             super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    sVar4 = (long)(peVar2->
                  super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(peVar2->
                  super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 4;
LAB_001260ba:
    uVar5 = uVar1;
    if (offset == sVar4) {
      uVar5 = offset - 1;
    }
  }
  pos.second = offset;
  pos.first = uVar5;
  update_current(this,pos);
  return;
}

Assistant:

void increment()
                    {
                        std::pair<size_t,size_t> next = current_;
                        if(full_select_) {
                            next.first = next.second;
                            while(next.second < size()) {
                                next.second++;
                                if(valid_offset(next.second))
                                    break;
                            }
                            if(next.second == size())
                                next.first = next.second - 1;
                        }
                        else {
                            while(next.second < size()) {
                                next.first = next.second;
                                next.second++;
                                if(valid_offset(next.second))
                                    break;
                            }
                        }
                        update_current(next);
                    }